

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytecodeJitX86.c
# Opt level: O0

void sysbvm_jit_emitUnwindInfo(sysbvm_bytecodeJit_t *jit)

{
  sysbvm_bytecodeJit_t *jit_local;
  
  sysbvm_dwarf_cfi_endFDE(&jit->dwarfEhBuilder,(jit->instructions).size);
  sysbvm_dwarf_cfi_finish(&jit->dwarfEhBuilder);
  return;
}

Assistant:

static void sysbvm_jit_emitUnwindInfo(sysbvm_bytecodeJit_t *jit)
{
#ifdef _WIN32
    RUNTIME_FUNCTION runtimeFunction = {0};
    runtimeFunction.BeginAddress = 0;
    runtimeFunction.EndAddress = (DWORD)jit->instructions.size;
    sysbvm_bytecodeJit_addUnwindInfoBytes(jit, sizeof(runtimeFunction), (uint8_t*)&runtimeFunction);

    // Unwind_info
    size_t codeCount = jit->unwindInfoBytecode.size/2;
    int frameRegister = /* RBP */ 5;
    int frameOffset = jit->cfiFrameOffset;

    sysbvm_bytecodeJit_addUnwindInfoByte(jit, /*Version*/1  | (/* Flags*/0 << 3));
    sysbvm_bytecodeJit_addUnwindInfoByte(jit, (uint8_t)jit->prologueSize);
    sysbvm_bytecodeJit_addUnwindInfoByte(jit, (uint8_t)codeCount);
    sysbvm_bytecodeJit_addUnwindInfoByte(jit, (uint8_t) ((frameRegister) | (frameOffset << 4)));

    // Unwind codes must be sorted in descending order.
    uint16_t *unwindCodes = (uint16_t *)jit->unwindInfoBytecode.data;
    for(size_t i = 0; i < codeCount; ++i)
        sysbvm_dynarray_addAll(&jit->unwindInfo, 2, unwindCodes + codeCount - i - 1);

    if((codeCount % 2) != 0)
    {
        sysbvm_bytecodeJit_addUnwindInfoByte(jit, 0);
        sysbvm_bytecodeJit_addUnwindInfoByte(jit, 0);
    }
#endif
    sysbvm_dwarf_cfi_endFDE(&jit->dwarfEhBuilder, jit->instructions.size);
    sysbvm_dwarf_cfi_finish(&jit->dwarfEhBuilder);
}